

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_DecodeStatus
upb_Decode(char *buf,size_t size,upb_Message *msg,upb_MiniTable *mt,upb_ExtensionRegistry *extreg,
          int options,upb_Arena *arena)

{
  _Bool _Var1;
  upb_DecodeStatus uVar2;
  uint local_1c0;
  undefined1 local_1b8 [4];
  uint depth;
  upb_Decoder decoder;
  int options_local;
  upb_ExtensionRegistry *extreg_local;
  upb_MiniTable *mt_local;
  upb_Message *msg_local;
  size_t size_local;
  char *buf_local;
  
  decoder.debug_valstart._4_4_ = options;
  size_local = (size_t)buf;
  _Var1 = upb_Message_IsFrozen(msg);
  if (_Var1) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/decode.c"
                  ,0x567,
                  "upb_DecodeStatus upb_Decode(const char *, size_t, upb_Message *, const upb_MiniTable *, const upb_ExtensionRegistry *, int, upb_Arena *)"
                 );
  }
  local_1c0 = decoder.debug_valstart._4_4_ >> 0x10;
  upb_EpsCopyInputStream_Init
            ((upb_EpsCopyInputStream *)local_1b8,(char **)&size_local,size,
             (decoder.debug_valstart._4_4_ & 1) != 0);
  decoder.extreg = (upb_ExtensionRegistry *)0x0;
  if (local_1c0 == 0) {
    local_1c0 = 100;
  }
  decoder.unknown_msg._0_4_ = local_1c0;
  decoder.unknown_msg._4_4_ = 0xffffffff;
  decoder.depth._0_2_ = (undefined2)decoder.debug_valstart._4_4_;
  decoder.depth._2_1_ = 0;
  decoder.field_8._48_4_ = 0;
  decoder.input._56_8_ = extreg;
  _upb_Arena_SwapIn_dont_copy_me__upb_internal_use_only((upb_Arena *)&decoder.options,arena);
  uVar2 = upb_Decoder_Decode((upb_Decoder *)local_1b8,(char *)size_local,msg,mt,arena);
  return uVar2;
}

Assistant:

upb_DecodeStatus upb_Decode(const char* buf, size_t size, upb_Message* msg,
                            const upb_MiniTable* mt,
                            const upb_ExtensionRegistry* extreg, int options,
                            upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Decoder decoder;
  unsigned depth = (unsigned)options >> 16;

  upb_EpsCopyInputStream_Init(&decoder.input, &buf, size,
                              options & kUpb_DecodeOption_AliasString);

  decoder.extreg = extreg;
  decoder.unknown = NULL;
  decoder.depth = depth ? depth : kUpb_WireFormat_DefaultDepthLimit;
  decoder.end_group = DECODE_NOGROUP;
  decoder.options = (uint16_t)options;
  decoder.missing_required = false;
  decoder.status = kUpb_DecodeStatus_Ok;

  // Violating the encapsulation of the arena for performance reasons.
  // This is a temporary arena that we swap into and swap out of when we are
  // done.  The temporary arena only needs to be able to handle allocation,
  // not fuse or free, so it does not need many of the members to be initialized
  // (particularly parent_or_count).
  UPB_PRIVATE(_upb_Arena_SwapIn)(&decoder.arena, arena);

  return upb_Decoder_Decode(&decoder, buf, msg, mt, arena);
}